

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mark.hpp
# Opt level: O1

Mark * __thiscall bm::Mark::average(Mark *__return_storage_ptr__,Mark *this)

{
  _Any_data local_38;
  code *local_28;
  undefined8 uStack_20;
  duration<unsigned_long,_std::ratio<1L,_1000000000L>_> local_18;
  
  if (this->_iterations == 0) {
    local_28 = (code *)0x0;
    uStack_20 = 0;
    local_38._M_unused._M_object = (void *)0x0;
    local_38._8_8_ = 0;
    std::function<void_(const_bm::Mark_&)>::function
              (&__return_storage_ptr__->_overflow_callback,
               (function<void_(const_bm::Mark_&)> *)&local_38);
    (__return_storage_ptr__->_min).__r = 0x7fffffffffffffff;
    (__return_storage_ptr__->_max).__r = -0x8000000000000000;
    (__return_storage_ptr__->_total).__r = 0;
    __return_storage_ptr__->_iterations = 0;
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
  }
  else {
    local_18.__r = (ulong)(this->_total).__r / this->_iterations;
    Mark<unsigned_long,std::ratio<1l,1000000000l>>(__return_storage_ptr__,&local_18);
  }
  return __return_storage_ptr__;
}

Assistant:

Mark average() const
    {
        return (_iterations == 0) ? Mark() : Mark(_total/_iterations);
    }